

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_eor_16_pd(void)

{
  ushort uVar1;
  uint uVar2;
  uint address;
  uint value;
  
  uVar2 = m68ki_cpu.ir;
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = address;
  uVar1 = *(ushort *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 7 & 0x1c));
  uVar2 = m68ki_read_16_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  value = uVar2 & 0xffff ^ (uint)uVar1;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_eor_16_pd(void)
{
	uint ea = EA_AY_PD_16();
	uint res = MASK_OUT_ABOVE_16(DX ^ m68ki_read_16(ea));

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}